

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O0

int worker_init(worker_handle *wh)

{
  int local_24;
  condvar_handle *pcStack_20;
  int ret;
  worker_priv *priv;
  worker_handle *wh_local;
  
  pcStack_20 = (condvar_handle *)wh->priv;
  if (pcStack_20 == (condvar_handle *)0x0) {
    pcStack_20 = (condvar_handle *)calloc(1,0x40);
    if (pcStack_20 == (condvar_handle *)0x0) {
      return -0xc;
    }
    wh->priv = pcStack_20;
  }
  local_24 = condvar_init(pcStack_20);
  if (((-1 < local_24) && (local_24 = condvar_init(pcStack_20 + 1), -1 < local_24)) &&
     (local_24 = mutex_init((mutex_handle *)(pcStack_20 + 2)), -1 < local_24)) {
    pcStack_20[5].priv = wh;
    pcStack_20[4].priv = worker_func;
    *(uint *)&pcStack_20[6].priv = wh->stack_size;
    local_24 = thread_init((thread_handle *)(pcStack_20 + 3));
    if (-1 < local_24) {
      return 0;
    }
  }
  mutex_free((mutex_handle *)(pcStack_20 + 2));
  condvar_free(pcStack_20 + 1);
  condvar_free(pcStack_20);
  free(wh->priv);
  wh->priv = (void *)0x0;
  return local_24;
}

Assistant:

int worker_init(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		wh->priv = priv;
	}

	ret = condvar_init(&priv->condvar);
	if (ret < 0)
		goto worker_init_exit;

	ret = condvar_init(&priv->condvar_idle);
	if (ret < 0)
		goto worker_init_exit;

	ret = mutex_init(&priv->mutex);
	if (ret < 0)
		goto worker_init_exit;

	priv->thread.func_ctx = wh;
	priv->thread.func_ptr = worker_func;
	priv->thread.stack_size = wh->stack_size;
	ret = thread_init(&priv->thread);
	if (ret < 0)
		goto worker_init_exit;

	return 0;

worker_init_exit:
	mutex_free(&priv->mutex);

	condvar_free(&priv->condvar_idle);
	condvar_free(&priv->condvar);

	free(wh->priv);
	wh->priv = NULL;

	return ret;
}